

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall
cmdline::parser::option_with_value<unsigned_long>::option_with_value
          (option_with_value<unsigned_long> *this,string *name,char short_name,bool need,
          unsigned_long *def,string *desc)

{
  unsigned_long uVar1;
  string local_50;
  
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_00189798;
  std::__cxx11::string::string((string *)&this->nam,(string *)name);
  this->snam = short_name;
  this->need = need;
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  (this->desc)._M_string_length = 0;
  (this->desc).field_2._M_local_buf[0] = '\0';
  this->has = false;
  uVar1 = *def;
  this->def = uVar1;
  this->actual = uVar1;
  full_description(&local_50,this,desc);
  std::__cxx11::string::operator=((string *)&this->desc,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

option_with_value(const std::string& name, char short_name, bool need, const T& def, const std::string& desc)
            : nam(name), snam(short_name), need(need), has(false), def(def), actual(def) {
            this->desc = full_description(desc);
        }